

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QSize *sizePoints)

{
  QSize *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QPageSize local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&sizePoints[0xd].wd.m_i + 3) == '\0') {
    (**(code **)((long)*sizePoints + 0x130))(sizePoints);
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QPageSize::QPageSize(local_38,in_RDX,(QString *)&local_58,FuzzyMatch);
  supportedPageSizeMatch(this,(QPageSize *)sizePoints);
  QPageSize::~QPageSize(local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QSize &sizePoints) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    // Try to find a supported page size based on fuzzy-matched point size
    return supportedPageSizeMatch(QPageSize(sizePoints));
}